

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader14.cpp
# Opt level: O0

void __thiscall
COLLADASaxFWL::LibraryControllersLoader14::begin__vertex_weights(LibraryControllersLoader14 *this)

{
  vertex_weights__AttributeData *in_stack_00000018;
  LibraryControllersLoader14 *in_stack_00000020;
  
  begin__vertex_weights(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

bool LibraryControllersLoader14::begin__vertex_weights( const COLLADASaxFWL14::vertex_weights__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__vertex_weights(attributeData));
COLLADASaxFWL::vertex_weights__AttributeData attrData;
attrData.present_attributes = 0;
if ( (attributeData.present_attributes & COLLADASaxFWL14::vertex_weights__AttributeData::ATTRIBUTE_COUNT_PRESENT) == COLLADASaxFWL14::vertex_weights__AttributeData::ATTRIBUTE_COUNT_PRESENT ) {
    attrData.count = attributeData.count;
    attrData.present_attributes |= COLLADASaxFWL::vertex_weights__AttributeData::ATTRIBUTE_COUNT_PRESENT;
}
return mLoader->begin__vertex_weights(attrData);
}